

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::decode(ReadData *this,int desc)

{
  uchar local_48 [8];
  uchar headbuff [25];
  int flag;
  int desc_local;
  ReadData *this_local;
  
  this_local._4_4_ = ReadSocketData(this,&this->databuff,desc);
  if ((this_local._4_4_ == 0) &&
     (this_local._4_4_ = ReadHead(this,&this->databuff,local_48), this_local._4_4_ == 0)) {
    this_local._4_4_ = ReadMessage(this,&this->databuff,local_48);
  }
  return this_local._4_4_;
}

Assistant:

int ReadData::decode(int desc) {
    int flag;

    flag = ReadSocketData(databuff, desc);
    if(flag != 0)
        return flag;

    unsigned char headbuff[25];
    flag = ReadHead(databuff, headbuff);
    if(flag != 0)
        return flag;

    flag = ReadMessage(databuff, headbuff);
    return flag;
}